

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall nite::Batch::~Batch(Batch *this)

{
  Batch *this_local;
  
  unload(this);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::~vector(&this->objects);
  return;
}

Assistant:

nite::Batch::~Batch(){
	unload();
}